

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_observer.hpp
# Opt level: O1

void __thiscall
afsm::test::test_fsm_observer::
reject_event<afsm::state_machine<afsm::test::outer_machine,afsm::none,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::events::in_state>
          (test_fsm_observer *this,
          state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
          *param_1,in_state *param_2)

{
  long lVar1;
  ostream *poVar2;
  string local_48;
  string local_28;
  
  poVar2 = psst::operator<<((ostream *)&std::cerr,red|bright);
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 0x11;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x20;
  psst::util::demangle<afsm::test::events::in_state>();
  get_name_components(&local_48,&local_28,1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_48._M_dataplus._M_p,local_48._M_string_length);
  poVar2 = psst::operator<<(poVar2,clear);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,": Reject event.\n",0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
    reject_event(FSM const&, Event const&) const noexcept
    {
        using ::psst::ansi_color;
        using ::psst::util::demangle;
        ::std::cerr
             << (ansi_color::red | ansi_color::bright)
             << ::std::setw(event_name_width) << ::std::left
             << get_name_components(demangle<Event>(), 1)
             << ansi_color::clear
             << ": Reject event.\n";
    }